

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall Parameter<double>::internalSetData<double>(Parameter<double> *this,double data)

{
  bool bVar1;
  long in_RDI;
  RepType in_XMM0_Qa;
  bool result;
  double tmp;
  RepType local_18 [3];
  
  local_18[0] = 0.0;
  bVar1 = ParameterTraits<double>::convert(in_XMM0_Qa,local_18);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x30) = local_18[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }